

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_RGB_Image *img,int XP,int YP,int WP,int HP,int cx,int cy
          )

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int w;
  Fl_RGB_Image *pFVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  Fl_Surface_Device *pFVar10;
  Fl_Display_Device *pFVar11;
  byte *p;
  byte *pbVar12;
  int iVar13;
  Window WVar14;
  uchar *puVar15;
  int h;
  int y_1;
  int iVar16;
  byte *pbVar17;
  int iVar18;
  int Y;
  int H;
  int X;
  int W;
  uint local_50;
  uint local_4c;
  Fl_Xlib_Graphics_Driver *local_48;
  Fl_RGB_Image *local_40;
  int ny;
  int nx;
  
  if (((img->super_Fl_Image).d_ == 0) || (img->array == (uchar *)0x0)) {
    Fl_Image::draw_empty(&img->super_Fl_Image,XP,YP);
    return;
  }
  local_50 = cy;
  iVar18 = (img->super_Fl_Image).w_;
  local_4c = (img->super_Fl_Image).h_;
  local_48 = this;
  local_40 = img;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
            (fl_graphics_driver,(ulong)(uint)XP,(ulong)(uint)YP,WP,HP,&X,&Y,&W,&H);
  pFVar6 = local_40;
  iVar16 = (X - XP) + cx;
  if (iVar16 < 0) {
    W = W + iVar16;
    X = X - iVar16;
    iVar16 = 0;
  }
  if (iVar18 < W + iVar16) {
    W = iVar18 - iVar16;
  }
  if (W < 1) {
    return;
  }
  iVar18 = (Y - YP) + local_50;
  if (iVar18 < 0) {
    H = H + iVar18;
    Y = Y - iVar18;
    iVar18 = 0;
  }
  if ((int)local_4c < H + iVar18) {
    H = local_4c - iVar18;
  }
  if (H < 1) {
    return;
  }
  if (local_40->id_ == 0) {
    iVar13 = (local_40->super_Fl_Image).d_;
    if (iVar13 == 1) {
LAB_001b696e:
      uVar8 = XCreatePixmap(fl_display,
                            *(undefined8 *)
                             (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                            (local_40->super_Fl_Image).w_,(local_40->super_Fl_Image).h_,
                            fl_visual->depth);
      pFVar6->id_ = uVar8;
      WVar14 = fl_window;
      fl_window = (Window)uVar8;
      pFVar10 = Fl_Surface_Device::surface();
      pFVar11 = Fl_Display_Device::display_device();
      (*(pFVar11->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar11);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
      puVar15 = pFVar6->array;
      uVar4 = (pFVar6->super_Fl_Image).w_;
      uVar5 = (pFVar6->super_Fl_Image).h_;
      uVar8 = (pFVar6->super_Fl_Image).d_;
LAB_001b6aa6:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,puVar15,0,0,(ulong)uVar4,(ulong)uVar5,(ulong)uVar8,
                 (ulong)(uint)(pFVar6->super_Fl_Image).ld_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
      fl_window = WVar14;
      (*(pFVar10->super_Fl_Device)._vptr_Fl_Device[3])(pFVar10);
    }
    else {
      if (iVar13 != 4) {
        if (iVar13 != 3) goto LAB_001b6c2c;
        goto LAB_001b696e;
      }
      cVar7 = fl_can_do_alpha_blending();
      if (cVar7 != '\0') {
        uVar8 = XCreatePixmap(fl_display,
                              *(undefined8 *)
                               (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                              (pFVar6->super_Fl_Image).w_,(pFVar6->super_Fl_Image).h_,0x20);
        pFVar6->id_ = uVar8;
        WVar14 = fl_window;
        fl_window = (Window)uVar8;
        pFVar10 = Fl_Surface_Device::surface();
        pFVar11 = Fl_Display_Device::display_device();
        (*(pFVar11->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar11);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
        puVar15 = pFVar6->array;
        uVar4 = (pFVar6->super_Fl_Image).w_;
        uVar8 = (pFVar6->super_Fl_Image).d_ | 0x40000000;
        uVar5 = (pFVar6->super_Fl_Image).h_;
        goto LAB_001b6aa6;
      }
    }
    if (pFVar6->id_ == 0) {
LAB_001b6c2c:
      w = W;
      h = H;
      local_4c = X;
      local_50 = Y;
      local_48 = (Fl_Xlib_Graphics_Driver *)CONCAT44(local_48._4_4_,H);
      iVar13 = (pFVar6->super_Fl_Image).ld_;
      if (iVar13 == 0) {
        iVar9 = (pFVar6->super_Fl_Image).d_;
        iVar13 = (pFVar6->super_Fl_Image).w_ * iVar9;
      }
      else {
        iVar9 = (pFVar6->super_Fl_Image).d_;
      }
      pbVar17 = pFVar6->array + (long)(iVar16 * iVar9) + (long)(iVar18 * iVar13);
      iVar13 = iVar13 - iVar9 * W;
      p = (byte *)operator_new__((long)(W * H * 3));
      fl_read_image(p,local_4c,local_50,w,h,0);
      pbVar12 = p;
      if ((pFVar6->super_Fl_Image).d_ == 2) {
        for (; iVar18 = w, 0 < h; h = h + -1) {
          for (; 0 < iVar18; iVar18 = iVar18 + -1) {
            iVar16 = (uint)*pbVar17 * (uint)pbVar17[1];
            uVar8 = pbVar17[1] ^ 0xff;
            *pbVar12 = (byte)(*pbVar12 * uVar8 + iVar16 >> 8);
            pbVar12[1] = (byte)(pbVar12[1] * uVar8 + iVar16 >> 8);
            pbVar12[2] = (byte)(uVar8 * pbVar12[2] + iVar16 >> 8);
            pbVar12 = pbVar12 + 3;
            pbVar17 = pbVar17 + 2;
          }
          pbVar17 = pbVar17 + iVar13;
        }
      }
      else {
        for (; iVar18 = w, 0 < h; h = h + -1) {
          for (; 0 < iVar18; iVar18 = iVar18 + -1) {
            bVar1 = pbVar17[1];
            bVar2 = pbVar17[2];
            bVar3 = pbVar17[3];
            uVar8 = bVar3 ^ 0xff;
            *pbVar12 = (byte)(*pbVar12 * uVar8 + (uint)*pbVar17 * (uint)bVar3 >> 8);
            pbVar12[1] = (byte)(pbVar12[1] * uVar8 + (uint)bVar1 * (uint)bVar3 >> 8);
            pbVar12[2] = (byte)(uVar8 * pbVar12[2] + (uint)bVar2 * (uint)bVar3 >> 8);
            pbVar12 = pbVar12 + 3;
            pbVar17 = pbVar17 + 4;
          }
          pbVar17 = pbVar17 + iVar13;
        }
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,p,(ulong)local_4c,(ulong)local_50,(ulong)(uint)w,
                 (ulong)local_48 & 0xffffffff,3,0);
      operator_delete__(p);
      return;
    }
  }
  if (pFVar6->mask_ != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H,&nx,
               &ny,&W,&H);
    iVar16 = (nx - X) + iVar16;
    X = nx;
    iVar18 = (ny - Y) + iVar18;
    Y = ny;
    XSetClipMask(fl_display,fl_gc,pFVar6->mask_);
    XSetClipOrigin(fl_display,fl_gc,X - iVar16,Y - iVar18);
  }
  if ((pFVar6->super_Fl_Image).d_ == 4) {
    cVar7 = fl_can_do_alpha_blending();
    uVar8 = pFVar6->id_;
    if (cVar7 != '\0') {
      copy_offscreen_with_alpha(local_48,X,Y,W,H,(ulong)uVar8,iVar16,iVar18);
      goto LAB_001b6bf9;
    }
  }
  else {
    uVar8 = pFVar6->id_;
  }
  copy_offscreen(local_48,X,Y,W,H,(ulong)uVar8,iVar16,iVar18);
LAB_001b6bf9:
  if (pFVar6->mask_ != 0) {
    XSetClipOrigin(fl_display,fl_gc,0,0);
    fl_restore_clip();
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_RGB_Image *img, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  // Don't draw an empty image...
  if (!img->d() || !img->array) {
    img->draw_empty(XP, YP);
    return;
  }
  if (start(img, XP, YP, WP, HP, img->w(), img->h(), cx, cy, X, Y, W, H)) {
    return;
  }
  if (!img->id_) {
    if (img->d() == 1 || img->d() == 3) {
      img->id_ = fl_create_offscreen(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d(), img->ld());
      fl_end_offscreen();
    } else if (img->d() == 4 && fl_can_do_alpha_blending()) {
      img->id_ = fl_create_offscreen_with_alpha(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d() | FL_IMAGE_WITH_ALPHA,
                    img->ld());
      fl_end_offscreen();
    }
  }
  if (img->id_) {
    if (img->mask_) {
      // I can't figure out how to combine a mask with existing region,
      // so cut the image down to a clipped rectangle:
      int nx, ny; fl_clip_box(X,Y,W,H,nx,ny,W,H);
      cx += nx-X; X = nx;
      cy += ny-Y; Y = ny;
      // make X use the bitmap as a mask:
      XSetClipMask(fl_display, fl_gc, img->mask_);
      int ox = X-cx; if (ox < 0) ox += img->w();
      int oy = Y-cy; if (oy < 0) oy += img->h();
      XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    }

    if (img->d() == 4 && fl_can_do_alpha_blending())
      copy_offscreen_with_alpha(X, Y, W, H, img->id_, cx, cy);
    else
      copy_offscreen(X, Y, W, H, img->id_, cx, cy);

    if (img->mask_) {
      // put the old clip region back
      XSetClipOrigin(fl_display, fl_gc, 0, 0);
      fl_restore_clip();
    }
  } else {
    // Composite image with alpha manually each time...
    alpha_blend(img, X, Y, W, H, cx, cy);
  }
}